

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa20.cpp
# Opt level: O0

void __thiscall salsa20::salsa20(salsa20 *this,string *key,string *nonce)

{
  uint32_t uVar1;
  ulong uVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  pointer __result;
  size_type __n;
  pointer __result_00;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  difference_type local_a8;
  value_type_conflict local_94;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  value_type_conflict1 local_71;
  array<unsigned_char,_8UL> local_70;
  array<unsigned_char,_8UL> nonce_array;
  long minimal_size;
  undefined1 local_40 [8];
  array<unsigned_char,_32UL> key_array;
  string *nonce_local;
  string *key_local;
  salsa20 *this_local;
  
  minimal_size._7_1_ = 0;
  key_array._M_elems._24_8_ = nonce;
  std::array<unsigned_char,_32UL>::fill
            ((array<unsigned_char,_32UL> *)local_40,
             (value_type_conflict1 *)((long)&minimal_size + 7));
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 0x21) {
    local_a8 = std::__cxx11::string::length();
  }
  else {
    local_a8 = 0x20;
  }
  __first._M_current = (char *)std::__cxx11::string::begin();
  nonce_array._M_elems = (_Type)std::__cxx11::string::begin();
  __last = __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&nonce_array,local_a8);
  __result = std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)local_40);
  std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_char*>
            (__first,__last,__result);
  local_71 = '\0';
  std::array<unsigned_char,_8UL>::fill(&local_70,&local_71);
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 9) {
    std::__cxx11::string::length();
  }
  local_80._M_current = (char *)std::__cxx11::string::begin();
  local_90._M_current = (char *)std::__cxx11::string::begin();
  __n = std::array<unsigned_char,_8UL>::size(&local_70);
  local_88 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_90,__n);
  __result_00 = std::array<unsigned_char,_8UL>::data(&local_70);
  std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_char*>
            (local_80,local_88,__result_00);
  local_94 = 0;
  std::array<unsigned_int,_16UL>::fill(&this->m_array,&local_94);
  uVar1 = convert(this,"quack constant!!");
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,0);
  *pvVar3 = uVar1;
  pvVar4 = std::array<unsigned_char,_32UL>::operator[]((array<unsigned_char,_32UL> *)local_40,0);
  uVar1 = convert(this,pvVar4);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,1);
  *pvVar3 = uVar1;
  pvVar4 = std::array<unsigned_char,_32UL>::operator[]((array<unsigned_char,_32UL> *)local_40,4);
  uVar1 = convert(this,pvVar4);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,2);
  *pvVar3 = uVar1;
  pvVar4 = std::array<unsigned_char,_32UL>::operator[]((array<unsigned_char,_32UL> *)local_40,8);
  uVar1 = convert(this,pvVar4);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,3);
  *pvVar3 = uVar1;
  pvVar4 = std::array<unsigned_char,_32UL>::operator[]((array<unsigned_char,_32UL> *)local_40,0xc);
  uVar1 = convert(this,pvVar4);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,4);
  *pvVar3 = uVar1;
  uVar1 = convert(this,"k constant!!");
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,5);
  *pvVar3 = uVar1;
  pvVar5 = std::array<unsigned_char,_8UL>::operator[](&local_70,0);
  uVar1 = convert(this,pvVar5);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,6);
  *pvVar3 = uVar1;
  pvVar5 = std::array<unsigned_char,_8UL>::operator[](&local_70,4);
  uVar1 = convert(this,pvVar5);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,7);
  *pvVar3 = uVar1;
  uVar1 = convert(this,"nstant!!");
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,10);
  *pvVar3 = uVar1;
  pvVar4 = std::array<unsigned_char,_32UL>::operator[]((array<unsigned_char,_32UL> *)local_40,0x10);
  uVar1 = convert(this,pvVar4);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,0xb);
  *pvVar3 = uVar1;
  pvVar4 = std::array<unsigned_char,_32UL>::operator[]((array<unsigned_char,_32UL> *)local_40,0x14);
  uVar1 = convert(this,pvVar4);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,0xc);
  *pvVar3 = uVar1;
  pvVar4 = std::array<unsigned_char,_32UL>::operator[]((array<unsigned_char,_32UL> *)local_40,0x18);
  uVar1 = convert(this,pvVar4);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,0xd);
  *pvVar3 = uVar1;
  pvVar4 = std::array<unsigned_char,_32UL>::operator[]((array<unsigned_char,_32UL> *)local_40,0x1c);
  uVar1 = convert(this,pvVar4);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,0xe);
  *pvVar3 = uVar1;
  uVar1 = convert(this,"nt!!");
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,0xf);
  *pvVar3 = uVar1;
  return;
}

Assistant:

salsa20::salsa20(const std::string &key, const std::string &nonce)
{
    /* if key size is not same sizes::key_size
     * copy part of key, or all key bytes and fill other by 0x0
     */
    std::array<uint8_t, sizes::key_size> key_array;
    key_array.fill(0x0);
    long minimal_size = sizes::key_size < key.length() ? sizes::key_size : static_cast<long>(key.length());
    std::copy(key.begin(), key.begin() + minimal_size, key_array.data());

    std::array<uint8_t, sizes::nonce_size> nonce_array;
    nonce_array.fill(0x0);
    minimal_size = sizes::nonce_size < nonce.length() ? sizes::key_size : static_cast<long>(nonce.length());
    std::copy(nonce.begin(), nonce.begin() + nonce_array.size(), nonce_array.data());

    m_array.fill(0x0);

    // initial state of array
    m_array[0] = convert(&constants[0]);
    m_array[1] = convert(&key_array[0]);
    m_array[2] = convert(&key_array[4]);
    m_array[3] = convert(&key_array[8]);
    m_array[4] = convert(&key_array[12]);
    m_array[5] = convert(&constants[4]);

    m_array[6] = convert(&nonce_array[0]);
    m_array[7] = convert(&nonce_array[sizeof (uint32_t)]);

    m_array[10] = convert(&constants[8]);
    m_array[11] = convert(&key_array[16]);
    m_array[12] = convert(&key_array[20]);
    m_array[13] = convert(&key_array[24]);
    m_array[14] = convert(&key_array[28]);
    m_array[15] = convert(&constants[12]);
}